

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O1

void __thiscall
myvk::RenderPassState::RegisterAttachment
          (RenderPassState *this,uint32_t attachment,char *attachment_str,VkFormat format,
          VkImageLayout initial_layout,VkImageLayout final_layout,VkSampleCountFlagBits samples,
          VkAttachmentLoadOp load_op,VkAttachmentStoreOp store_op,VkAttachmentLoadOp stencil_load_op
          ,VkAttachmentStoreOp stencil_store_op)

{
  long lVar1;
  ulong uVar2;
  allocator<char> local_5d;
  VkImageLayout local_5c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_58;
  
  local_5c = final_layout;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,attachment_str,&local_5d);
  local_58.second = attachment;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              *)(this + 0x30),&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  uVar2 = (ulong)attachment;
  lVar1 = *(long *)(this + 0x60);
  *(undefined4 *)(lVar1 + uVar2 * 0x24) = 0;
  *(VkFormat *)(lVar1 + 4 + uVar2 * 0x24) = format;
  *(VkImageLayout *)(lVar1 + 0x1c + uVar2 * 0x24) = initial_layout;
  *(VkImageLayout *)(lVar1 + 0x20 + uVar2 * 0x24) = local_5c;
  *(VkSampleCountFlagBits *)(lVar1 + 8 + uVar2 * 0x24) = samples;
  *(VkAttachmentLoadOp *)(lVar1 + 0xc + uVar2 * 0x24) = load_op;
  *(VkAttachmentStoreOp *)(lVar1 + 0x10 + uVar2 * 0x24) = store_op;
  *(VkAttachmentLoadOp *)(lVar1 + 0x14 + uVar2 * 0x24) = stencil_load_op;
  *(VkAttachmentStoreOp *)(lVar1 + 0x18 + uVar2 * 0x24) = stencil_store_op;
  return;
}

Assistant:

void RenderPassState::RegisterAttachment(uint32_t attachment, const char *attachment_str, VkFormat format,
                                         VkImageLayout initial_layout, VkImageLayout final_layout,
                                         VkSampleCountFlagBits samples, VkAttachmentLoadOp load_op,
                                         VkAttachmentStoreOp store_op, VkAttachmentLoadOp stencil_load_op,
                                         VkAttachmentStoreOp stencil_store_op) {
	assert(attachment < get_attachment_count());
	assert(m_attachment_map.find(attachment_str) == m_attachment_map.end());
	assert(m_attachment_descriptions[attachment].flags == VK_ATTACHMENT_DESCRIPTION_FLAG_BITS_MAX_ENUM);

	m_attachment_map.insert({attachment_str, attachment});
	VkAttachmentDescription &des = m_attachment_descriptions[attachment];
	des.flags = 0; // TODO: attachment description flags ?
	des.format = format;
	des.initialLayout = initial_layout;
	des.finalLayout = final_layout;
	des.samples = samples;
	des.loadOp = load_op;
	des.storeOp = store_op;
	des.stencilLoadOp = stencil_load_op;
	des.stencilStoreOp = stencil_store_op;
}